

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_image
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,CImg<unsigned_char> *sprite,
          float opacity)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uchar *puVar9;
  CImg<unsigned_char> *pCVar10;
  float extraout_XMM0_Da;
  type_conflict1 tVar11;
  uint local_1fc;
  uint local_1f4;
  uint local_1ec;
  uint local_1e4;
  int local_1d4;
  int local_1bc;
  int local_1ac;
  int local_19c;
  uint local_190;
  int local_180;
  uint local_170;
  int local_160;
  int local_150;
  int local_140;
  int local_130;
  int local_120;
  int local_e4;
  int local_e0;
  int x;
  int y_1;
  int y;
  int z;
  int v;
  uchar *ptrd;
  float local_c0;
  float local_bc;
  float copacity;
  float nopacity;
  unsigned_long slX;
  unsigned_long soffZ;
  unsigned_long offZ;
  unsigned_long soffY;
  unsigned_long offY;
  unsigned_long soffX;
  unsigned_long offX;
  uchar *ptrs;
  int lC;
  int lZ;
  int lY;
  int lX;
  bool bc;
  bool bz;
  bool by;
  bool bx;
  CImg<unsigned_char> local_58;
  float local_34;
  CImg<unsigned_char> *pCStack_30;
  float opacity_local;
  CImg<unsigned_char> *sprite_local;
  int c0_local;
  int z0_local;
  int y0_local;
  int x0_local;
  CImg<unsigned_char> *this_local;
  
  local_34 = opacity;
  pCStack_30 = sprite;
  sprite_local._0_4_ = c0;
  sprite_local._4_4_ = z0;
  c0_local = y0;
  z0_local = x0;
  _y0_local = this;
  bVar3 = is_empty(this);
  this_local = this;
  if ((!bVar3) &&
     (puVar9 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)pCStack_30),
     puVar9 != (uchar *)0x0)) {
    bVar3 = is_overlapped<unsigned_char>(this,pCStack_30);
    iVar8 = z0_local;
    iVar7 = c0_local;
    uVar2 = sprite_local._4_4_;
    uVar1 = (uint)sprite_local;
    if (bVar3) {
      operator+(&local_58,pCStack_30);
      this_local = draw_image(this,iVar8,iVar7,uVar2,uVar1,&local_58,local_34);
      ~CImg(&local_58);
    }
    else if (((((z0_local != 0) || (c0_local != 0)) || (sprite_local._4_4_ != 0)) ||
             (((uint)sprite_local != 0 ||
              (bVar3 = is_sameXYZC<unsigned_char>(this,pCStack_30), !bVar3)))) ||
            ((local_34 < 1.0 || (bVar3 = is_shared(this), bVar3)))) {
      lY._3_1_ = z0_local < 0;
      lY._2_1_ = c0_local < 0;
      lY._1_1_ = (int)sprite_local._4_4_ < 0;
      lY._0_1_ = (int)(uint)sprite_local < 0;
      iVar4 = width(pCStack_30);
      iVar7 = z0_local;
      iVar5 = width(pCStack_30);
      iVar6 = width(this);
      iVar8 = z0_local;
      if (iVar6 < iVar7 + iVar5) {
        iVar7 = width(pCStack_30);
        local_120 = width(this);
        local_120 = (iVar8 + iVar7) - local_120;
      }
      else {
        local_120 = 0;
      }
      if ((lY._3_1_ & 1) == 0) {
        local_130 = 0;
      }
      else {
        local_130 = z0_local;
      }
      lZ = (iVar4 - local_120) + local_130;
      iVar4 = height(pCStack_30);
      iVar7 = c0_local;
      iVar5 = height(pCStack_30);
      iVar6 = height(this);
      iVar8 = c0_local;
      if (iVar6 < iVar7 + iVar5) {
        iVar7 = height(pCStack_30);
        local_140 = height(this);
        local_140 = (iVar8 + iVar7) - local_140;
      }
      else {
        local_140 = 0;
      }
      if ((lY._2_1_ & 1) == 0) {
        local_150 = 0;
      }
      else {
        local_150 = c0_local;
      }
      lC = (iVar4 - local_140) + local_150;
      iVar7 = depth(pCStack_30);
      uVar1 = sprite_local._4_4_;
      iVar8 = depth(pCStack_30);
      iVar4 = depth(this);
      uVar2 = sprite_local._4_4_;
      if (iVar4 < (int)(uVar1 + iVar8)) {
        iVar8 = depth(pCStack_30);
        local_160 = depth(this);
        local_160 = (uVar2 + iVar8) - local_160;
      }
      else {
        local_160 = 0;
      }
      if ((lY._1_1_ & 1) == 0) {
        local_170 = 0;
      }
      else {
        local_170 = sprite_local._4_4_;
      }
      ptrs._4_4_ = (iVar7 - local_160) + local_170;
      iVar7 = spectrum(pCStack_30);
      uVar1 = (uint)sprite_local;
      iVar8 = spectrum(pCStack_30);
      pCVar10 = this;
      iVar4 = spectrum(this);
      uVar2 = (uint)sprite_local;
      iVar5 = (int)pCVar10;
      if (iVar4 < (int)(uVar1 + iVar8)) {
        iVar8 = spectrum(pCStack_30);
        pCVar10 = this;
        local_180 = spectrum(this);
        iVar5 = (int)pCVar10;
        local_180 = (uVar2 + iVar8) - local_180;
      }
      else {
        local_180 = 0;
      }
      local_1ac = c0_local;
      if (((byte)lY & 1) == 0) {
        local_190 = 0;
      }
      else {
        local_190 = (uint)sprite_local;
      }
      ptrs._0_4_ = (iVar7 - local_180) + local_190;
      puVar9 = pCStack_30->_data;
      if ((lY._3_1_ & 1) == 0) {
        local_19c = 0;
      }
      else {
        local_19c = z0_local;
      }
      if ((lY._2_1_ & 1) == 0) {
        local_1ac = 0;
      }
      else {
        pCVar10 = pCStack_30;
        iVar7 = width(pCStack_30);
        iVar5 = (int)pCVar10;
        local_1ac = local_1ac * iVar7;
      }
      uVar1 = sprite_local._4_4_;
      if ((lY._1_1_ & 1) == 0) {
        local_1bc = 0;
      }
      else {
        iVar7 = width(pCStack_30);
        pCVar10 = pCStack_30;
        local_1bc = height(pCStack_30);
        iVar5 = (int)pCVar10;
        local_1bc = uVar1 * iVar7 * local_1bc;
      }
      uVar1 = (uint)sprite_local;
      if (((byte)lY & 1) == 0) {
        local_1d4 = 0;
      }
      else {
        iVar7 = width(pCStack_30);
        iVar8 = height(pCStack_30);
        pCVar10 = pCStack_30;
        local_1d4 = depth(pCStack_30);
        iVar5 = (int)pCVar10;
        local_1d4 = uVar1 * iVar7 * iVar8 * local_1d4;
      }
      offX = (unsigned_long)
             (puVar9 + (((-(long)local_1ac - (long)local_19c) - (long)local_1bc) - (long)local_1d4))
      ;
      soffX = (ulong)this->_width - (long)lZ;
      offY = (ulong)pCStack_30->_width - (long)lZ;
      soffY = (ulong)this->_width * (ulong)(this->_height - lC);
      offZ = (ulong)pCStack_30->_width * (ulong)(pCStack_30->_height - lC);
      soffZ = (ulong)this->_width * (ulong)this->_height * (ulong)(this->_depth - ptrs._4_4_);
      slX = (ulong)pCStack_30->_width * (ulong)pCStack_30->_height *
            (ulong)(pCStack_30->_depth - ptrs._4_4_);
      _copacity = (size_t)lZ;
      cimg::abs(iVar5);
      ptrd._4_4_ = 0;
      local_bc = extraout_XMM0_Da;
      tVar11 = cimg::max<float,int>(&local_34,(int *)((long)&ptrd + 4));
      local_c0 = 1.0 - tVar11;
      if (((0 < lZ) && (0 < lC)) && ((0 < ptrs._4_4_ && (0 < (int)ptrs)))) {
        if (z0_local < 0) {
          local_1e4 = 0;
        }
        else {
          local_1e4 = z0_local;
        }
        if (c0_local < 0) {
          local_1ec = 0;
        }
        else {
          local_1ec = c0_local;
        }
        if ((int)sprite_local._4_4_ < 0) {
          local_1f4 = 0;
        }
        else {
          local_1f4 = sprite_local._4_4_;
        }
        if ((int)(uint)sprite_local < 0) {
          local_1fc = 0;
        }
        else {
          local_1fc = (uint)sprite_local;
        }
        _z = data(this,local_1e4,local_1ec,local_1f4,local_1fc);
        for (y = 0; y < (int)ptrs; y = y + 1) {
          for (y_1 = 0; y_1 < ptrs._4_4_; y_1 = y_1 + 1) {
            if (local_34 < 1.0) {
              for (local_e0 = 0; local_e0 < lC; local_e0 = local_e0 + 1) {
                for (local_e4 = 0; local_e4 < lZ; local_e4 = local_e4 + 1) {
                  *_z = (byte)(int)(local_bc * (float)*(byte *)offX + (float)*_z * local_c0);
                  _z = _z + 1;
                  offX = offX + 1;
                }
                _z = _z + soffX;
                offX = offY + offX;
              }
            }
            else {
              for (x = 0; x < lC; x = x + 1) {
                memcpy(_z,(void *)offX,_copacity);
                _z = _z + this->_width;
                offX = offX + pCStack_30->_width;
              }
            }
            _z = _z + soffY;
            offX = offZ + offX;
          }
          _z = _z + soffZ;
          offX = slX + offX;
        }
      }
    }
    else {
      this_local = assign<unsigned_char>(this,pCStack_30,false);
    }
  }
  return this_local;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<T>& sprite, const float opacity=1) {
      if (is_empty() || !sprite) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,opacity);
      if (x0==0 && y0==0 && z0==0 && c0==0 && is_sameXYZC(sprite) && opacity>=1 && !is_shared())
        return assign(sprite,false);
      const bool bx = (x0<0), by = (y0<0), bz = (z0<0), bc = (c0<0);
      const int
        lX = sprite.width() - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0) + (bx?x0:0),
        lY = sprite.height() - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0) + (by?y0:0),
        lZ = sprite.depth() - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0) + (bz?z0:0),
        lC = sprite.spectrum() - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0) + (bc?c0:0);
      const T
        *ptrs = sprite._data -
        (bx?x0:0) -
        (by?y0*sprite.width():0) -
        (bz?z0*sprite.width()*sprite.height():0) -
        (bc?c0*sprite.width()*sprite.height()*sprite.depth():0);
      const unsigned long
        offX = (unsigned long)_width - lX,
        soffX = (unsigned long)sprite._width - lX,
        offY = (unsigned long)_width*(_height - lY),
        soffY = (unsigned long)sprite._width*(sprite._height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ),
        soffZ = (unsigned long)sprite._width*sprite._height*(sprite._depth - lZ),
        slX = lX*sizeof(T);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      if (lX>0 && lY>0 && lZ>0 && lC>0) {
        T *ptrd = data(x0<0?0:x0,y0<0?0:y0,z0<0?0:z0,c0<0?0:c0);
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            if (opacity>=1)
              for (int y = 0; y<lY; ++y) { std::memcpy(ptrd,ptrs,slX); ptrd+=_width; ptrs+=sprite._width; }
            else for (int y = 0; y<lY; ++y) {
                for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*(*(ptrs++)) + *ptrd*copacity); ++ptrd; }
                ptrd+=offX; ptrs+=soffX;
              }
            ptrd+=offY; ptrs+=soffY;
          }
          ptrd+=offZ; ptrs+=soffZ;
        }
      }
      return *this;
    }